

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

void do_buy(CHAR_DATA *ch,char *argument)

{
  byte *pbVar1;
  short sVar2;
  ROOM_INDEX_DATA *pRVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CHAR_DATA *pCVar9;
  ROOM_INDEX_DATA *pRVar10;
  OBJ_DATA *obj;
  ulong uVar11;
  OBJ_DATA *pOVar12;
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj_00;
  long lVar13;
  char *pcVar14;
  CProficiencies *pCVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  long cost;
  byte bVar16;
  uint uVar17;
  OBJ_DATA *pOVar18;
  float fVar19;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  string buffer;
  char *local_2458 [2];
  char *local_2448;
  char buf [4608];
  char arg [4608];
  
  bVar4 = check_horde(ch);
  if (bVar4) {
    pcVar14 = "You would never buy what can be be taken!\n\r";
LAB_002bfb35:
    send_to_char(pcVar14,ch);
    return;
  }
  if (*argument == '\0') {
    pcVar14 = "Buy what?\n\r";
    goto LAB_002bfb35;
  }
  if ((ch->in_room->room_flags[0] & 0x1000) == 0) {
    pCVar9 = find_keeper(ch);
    if (pCVar9 == ch || pCVar9 == (CHAR_DATA *)0x0) {
      return;
    }
    pcVar14 = one_argument(argument,arg);
    if (*pcVar14 == '\0') {
      uVar5 = 1;
    }
    else {
      uVar5 = atoi(pcVar14);
    }
    obj = get_obj_keeper(ch,pCVar9,arg);
    uVar11 = get_cost(pCVar9,obj,false);
    if ((int)uVar5 < 1) {
      interpret(pCVar9,"snort");
      return;
    }
    if (9 < uVar5) {
      do_say(pCVar9,"I\'m not selling you that many at once.");
      return;
    }
    if (((long)uVar11 < 1) || (bVar4 = can_see_obj(ch,obj), !bVar4)) {
      sprintf(buf,"%s I don\'t sell that, try \'list\'ing to see what I do sell.",ch->name);
      do_tell(pCVar9,buf);
      return;
    }
    bVar4 = is_obj_stat(obj,0xd);
    if (!bVar4) {
      iVar6 = 1;
      pOVar12 = obj;
      do {
        if (((int)uVar5 <= iVar6) || (pOVar12 = pOVar12->next_content, pOVar12 == (OBJ_DATA *)0x0))
        {
          if ((int)uVar5 <= iVar6) goto LAB_002bfc9b;
          break;
        }
        if (pOVar12->pIndexData != obj->pIndexData) break;
        bVar4 = str_cmp(pOVar12->short_descr,obj->short_descr);
        iVar6 = iVar6 + 1;
      } while (!bVar4);
      pcVar14 = "$n tells you \'I don\'t have that many in stock.";
      obj = (OBJ_DATA *)0x0;
LAB_002bfe04:
      act(pcVar14,pCVar9,obj,ch,2);
      ch->reply = pCVar9;
      return;
    }
LAB_002bfc9b:
    if (ch->gold < (long)(uVar11 * uVar5)) {
      pcVar14 = "$n tells you \'You can\'t afford to buy that many.";
      if (uVar5 == 1) {
        pcVar14 = "$n tells you \'You can\'t afford to buy $p\'.";
      }
      goto LAB_002bfe04;
    }
    if (ch->level < obj->level) {
      pcVar14 = "$n tells you \'You can\'t use $p yet\'.";
      goto LAB_002bfe04;
    }
    sVar2 = ch->carry_number;
    iVar6 = get_obj_number(obj);
    iVar7 = can_carry_n(ch);
    if (iVar7 < (int)(iVar6 * uVar5 + (int)sVar2)) {
      pcVar14 = "You can\'t carry that many items.\n\r";
      goto LAB_002bfc4c;
    }
    sVar2 = ch->carry_weight;
    iVar6 = get_obj_weight(obj);
    iVar7 = can_carry_w(ch);
    if (iVar7 < (int)(iVar6 * uVar5 + (int)sVar2)) {
      pcVar14 = "You can\'t carry that much weight.\n\r";
      goto LAB_002bfc4c;
    }
    bVar4 = check_benevolence(ch,pCVar9);
    uVar11 = uVar11 >> bVar4;
    iVar6 = number_percent();
    bVar4 = is_obj_stat(obj,0x16);
    if ((bVar4) || (iVar7 = get_skill(ch,(int)gsn_haggle), iVar7 <= iVar6)) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar15 = &prof_none;
      }
      else {
        pCVar15 = &ch->pcdata->profs;
      }
      bVar4 = CProficiencies::HasProf(pCVar15,"appraising");
      bVar16 = 1;
      if (!bVar4) goto LAB_002c021f;
    }
    else {
      bVar16 = 0;
    }
    iVar7 = get_skill(ch,(int)gsn_haggle);
    if (0x3c < iVar7) {
      uVar11 = uVar11 - (long)(((obj->cost / 2) * iVar6) / 100);
    }
    if ((bool)(bVar16 & uVar11 != 0)) {
      if (ch->pcdata == (PC_DATA *)0x0) {
        pCVar15 = &prof_none;
      }
      else {
        pCVar15 = &ch->pcdata->profs;
      }
      fVar19 = CProficiencies::ProfEffect(pCVar15,"appraising",0.0);
      fVar19 = floorf((fVar19 * (float)(long)uVar11) / 100.0);
      uVar11 = (ulong)fVar19;
      sprintf(buf,"Knowing it is inflated, you argue the price down to %ld coins.\n\r",uVar11);
      send_to_char(buf,ch);
    }
    else {
      act("You haggle with $N.",ch,(void *)0x0,pCVar9,3);
    }
    check_improve(ch,(int)gsn_haggle,true,4);
LAB_002c021f:
    act("$n hands some gold to $N.",ch,(void *)0x0,pCVar9,0);
    sprintf(buf,"You hand $N %ld gold.");
    act(buf,ch,(void *)0x0,pCVar9,3);
    uVar17 = uVar5;
    while (bVar4 = uVar17 != 0, uVar17 = uVar17 - 1, bVar4) {
      act("$N hands you $p.",ch,obj,pCVar9,3);
      act("$N hands $n $p.",ch,obj,pCVar9,0);
    }
    deduct_cost(ch,uVar5 * uVar11);
    for (uVar17 = 0; uVar17 != uVar5; uVar17 = uVar17 + 1) {
      if ((obj->extra_flags[0] & 0x2000) == 0) {
        pOVar18 = obj->next_content;
        obj_from_char(obj);
        pOVar12 = obj;
        obj = pOVar18;
      }
      else {
        pOVar12 = create_object(obj->pIndexData,(int)obj->level);
        if ((obj->item_type == 0xf) && (pOVar18 = obj->contains, pOVar18 != (OBJ_DATA *)0x0)) {
          for (; pOVar18 != (OBJ_DATA *)0x0; pOVar18 = pOVar18->next_content) {
            pObjIndex = get_obj_index((int)pOVar18->pIndexData->vnum);
            obj_00 = create_object(pObjIndex,(int)pOVar18->level);
            obj_to_obj(obj_00,pOVar12);
          }
        }
      }
      if (0 < pOVar12->timer) {
        pOVar12->timer = 0;
      }
      obj_to_char(pOVar12,ch);
      if ((long)uVar11 < (long)pOVar12->cost) {
        pOVar12->cost = (int)uVar11;
      }
    }
    return;
  }
  bVar4 = is_npc(ch);
  if (bVar4) {
    return;
  }
  pcVar14 = one_argument(argument,arg);
  pRVar10 = get_room_index(ch->in_room->vnum + 1);
  pRVar3 = ch->in_room;
  if (pRVar10 == (ROOM_INDEX_DATA *)0x0) {
    fmt._M_str = "Do_buy: bad pet shop at vnum {}.";
    fmt._M_len = 0x20;
    CLogger::Debug<short&>((CLogger *)&RS.field_0x140,fmt,&pRVar3->vnum);
  }
  else {
    ch->in_room = pRVar10;
    pCVar9 = get_char_room(ch,arg);
    ch->in_room = pRVar3;
    if ((pCVar9 != (CHAR_DATA *)0x0) && ((pCVar9->act[0] & 0x100) != 0)) {
      if (ch->pet == (CHAR_DATA *)0x0) {
        sVar2 = pCVar9->level;
        lVar13 = (long)sVar2 * (long)sVar2;
        cost = lVar13 * 10;
        if (SBORROW8(ch->gold,cost) != ch->gold + lVar13 * -10 < 0) {
          pcVar14 = "You can\'t afford it.\n\r";
          goto LAB_002bfc4c;
        }
        if (ch->level < sVar2) {
          pcVar14 = "You\'re not powerful enough to master this pet.\n\r";
          goto LAB_002bfc4c;
        }
        iVar6 = number_percent();
        iVar7 = get_skill(ch,(int)gsn_haggle);
        if (iVar7 <= iVar6) {
          if (ch->pcdata == (PC_DATA *)0x0) {
            pCVar15 = &prof_none;
          }
          else {
            pCVar15 = &ch->pcdata->profs;
          }
          bVar4 = CProficiencies::HasProf(pCVar15,"appraising");
          if (!bVar4) goto LAB_002bffe2;
        }
        iVar8 = get_skill(ch,(int)gsn_haggle);
        if (0x3c < iVar8) {
          cost = cost + ((cost / 3) * (long)iVar6) / -100;
        }
        sprintf(buf,"You haggle the price down to %ld coins.\n\r",cost);
        if ((iVar7 <= iVar6) && (cost != 0)) {
          if (ch->pcdata == (PC_DATA *)0x0) {
            pCVar15 = &prof_none;
          }
          else {
            pCVar15 = &ch->pcdata->profs;
          }
          fVar19 = CProficiencies::ProfEffect(pCVar15,"appraising",0.0);
          cost = (long)(int)((fVar19 * (float)cost) / 100.0);
          sprintf(buf,"Knowing it is inflated, you argue the price down to %ld coins.\n\r",cost);
        }
        send_to_char(buf,ch);
        check_improve(ch,(int)gsn_haggle,true,4);
LAB_002bffe2:
        deduct_cost(ch,cost);
        pCVar9 = create_mobile(pCVar9->pIndexData);
        pbVar1 = (byte *)((long)pCVar9->act + 1);
        *pbVar1 = *pbVar1 | 1;
        pbVar1 = (byte *)((long)pCVar9->affected_by + 2);
        *pbVar1 = *pbVar1 | 4;
        pbVar1 = (byte *)((long)pCVar9->comm + 2);
        *pbVar1 = *pbVar1 | 0x70;
        one_argument(pcVar14,arg);
        if (arg[0] != '\0') {
          local_2458[0] = pCVar9->name;
          fmt_00.size_ = 0xcc;
          fmt_00.data_ = (char *)0x5;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)local_2458;
          local_2448 = arg;
          ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)0x3ea493,fmt_00,args);
          free_pstring(pCVar9->name);
          pcVar14 = palloc_string(buffer._M_dataplus._M_p);
          pCVar9->name = pcVar14;
          std::__cxx11::string::~string((string *)&buffer);
        }
        sprintf(buf,"%sA neck tag says \'I belong to %s\'.\n\r",pCVar9->description,ch->name);
        free_pstring(pCVar9->description);
        pcVar14 = palloc_string(buf);
        pCVar9->description = pcVar14;
        char_to_room(pCVar9,ch->in_room);
        add_follower(pCVar9,ch);
        pCVar9->leader = ch;
        ch->pet = pCVar9;
        send_to_char("Enjoy your pet.\n\r",ch);
        act("$n bought $N as a pet.",ch,(void *)0x0,pCVar9,0);
        return;
      }
      pcVar14 = "You already own a pet.\n\r";
      goto LAB_002bfc4c;
    }
  }
  pcVar14 = "Sorry, you can\'t buy that here.\n\r";
LAB_002bfc4c:
  send_to_char(pcVar14,ch);
  return;
}

Assistant:

void do_buy(CHAR_DATA *ch, char *argument)
{
	int roll;
	long cost;
	int i;

	if (check_horde(ch))
	{
		send_to_char("You would never buy what can be be taken!\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		send_to_char("Buy what?\n\r", ch);
		return;
	}

	if (IS_SET(ch->in_room->room_flags, ROOM_PET_SHOP))
	{
		char arg[MAX_INPUT_LENGTH];
		char buf[MAX_STRING_LENGTH];
		CHAR_DATA *pet;
		ROOM_INDEX_DATA *pRoomIndexNext;
		ROOM_INDEX_DATA *in_room;

		if (is_npc(ch))
			return;

		argument = one_argument(argument, arg);

		/* hack to make new thalos pets work */
		pRoomIndexNext = get_room_index(ch->in_room->vnum + 1);
		if (pRoomIndexNext == nullptr)
		{
			RS.Logger.Debug("Do_buy: bad pet shop at vnum {}.", ch->in_room->vnum);
			send_to_char("Sorry, you can't buy that here.\n\r", ch);
			return;
		}

		in_room = ch->in_room;
		ch->in_room = pRoomIndexNext;
		pet = get_char_room(ch, arg);
		ch->in_room = in_room;

		if (pet == nullptr || !IS_SET(pet->act, ACT_PET))
		{
			send_to_char("Sorry, you can't buy that here.\n\r", ch);
			return;
		}

		if (ch->pet != nullptr)
		{
			send_to_char("You already own a pet.\n\r", ch);
			return;
		}

		cost = 10L * pet->level * pet->level;

		if (ch->gold < cost)
		{
			send_to_char("You can't afford it.\n\r", ch);
			return;
		}

		if (ch->level < pet->level)
		{
			send_to_char("You're not powerful enough to master this pet.\n\r", ch);
			return;
		}

		/* haggle */
		roll = number_percent();

		bool appraised= false;

		if (roll < get_skill(ch, gsn_haggle) || (appraised = ch->Profs()->HasProf("appraising")))
		{
			if (get_skill(ch, gsn_haggle) > 60)
				cost -= cost / 3 * roll / 100;

			sprintf(buf, "You haggle the price down to %ld coins.\n\r", cost);

			if (appraised && cost)
			{
				float mcost = cost * ch->Profs()->ProfEffect("appraising") / 100;
				cost = (int)mcost;

				sprintf(buf, "Knowing it is inflated, you argue the price down to %ld coins.\n\r", cost);
			}

			send_to_char(buf, ch);
			check_improve(ch, gsn_haggle, true, 4);
		}

		deduct_cost(ch, cost);

		pet = create_mobile(pet->pIndexData);

		SET_BIT(pet->act, ACT_PET);
		SET_BIT(pet->affected_by, AFF_CHARM);
		SET_BIT(pet->comm, COMM_NOTELL);
		SET_BIT(pet->comm, COMM_NOSHOUT);
		SET_BIT(pet->comm, COMM_NOCHANNELS);

		argument = one_argument(argument, arg);

		if (arg[0] != '\0')
		{
			auto buffer = fmt::format("{} {}", pet->name, arg);
			free_pstring(pet->name);
			pet->name = palloc_string(buffer.c_str()); // TODO: not sure what palloc_string does
		}

		sprintf(buf, "%sA neck tag says 'I belong to %s'.\n\r", pet->description, ch->name);

		free_pstring(pet->description);
		pet->description = palloc_string(buf);

		char_to_room(pet, ch->in_room);
		add_follower(pet, ch);

		pet->leader = ch;
		ch->pet = pet;

		send_to_char("Enjoy your pet.\n\r", ch);
		act("$n bought $N as a pet.", ch, nullptr, pet, TO_ROOM);
		return;
	}
	else
	{
		CHAR_DATA *keeper;
		OBJ_DATA *obj = nullptr, *t_obj = nullptr, *d_obj = nullptr, *c_obj = nullptr;
		char arg[MAX_INPUT_LENGTH], buf[MSL];
		int number = 1, count = 1;

		keeper = find_keeper(ch);

		if (keeper == nullptr)
			return;

		if (keeper == ch)
			return;

		argument = one_argument(argument, arg);

		if (argument[0] != '\0')
			number = atoi(argument);

		obj = get_obj_keeper(ch, keeper, arg);
		cost = get_cost(keeper, obj, true);

		if (number < 1)
		{
			interpret(keeper, "snort");
			return;
		}

		if (number > 9)
		{
			do_say(keeper, "I'm not selling you that many at once.");
			return;
		}

		if (cost <= 0 || !can_see_obj(ch, obj))
		{
			sprintf(buf, "%s I don't sell that, try 'list'ing to see what I do sell.", ch->name);
			do_tell(keeper, buf);
			return;
		}

		if (!is_obj_stat(obj, ITEM_INVENTORY))
		{
			for (t_obj = obj->next_content; count < number && t_obj != nullptr; t_obj = t_obj->next_content)
			{
				if (t_obj->pIndexData == obj->pIndexData && !str_cmp(t_obj->short_descr, obj->short_descr))
					count++;
				else
					break;
			}

			if (count < number)
			{
				act("$n tells you 'I don't have that many in stock.", keeper, nullptr, ch, TO_VICT);
				ch->reply = keeper;
				return;
			}
		}

		if (ch->gold < cost * number)
		{
			if (number > 1)
				act("$n tells you 'You can't afford to buy that many.", keeper, obj, ch, TO_VICT);
			else
				act("$n tells you 'You can't afford to buy $p'.", keeper, obj, ch, TO_VICT);

			ch->reply = keeper;
			return;
		}

		if (obj->level > ch->level)
		{
			act("$n tells you 'You can't use $p yet'.", keeper, obj, ch, TO_VICT);
			ch->reply = keeper;
			return;
		}

		if (ch->carry_number + number * get_obj_number(obj) > can_carry_n(ch))
		{
			send_to_char("You can't carry that many items.\n\r", ch);
			return;
		}

		if (ch->carry_weight + number * get_obj_weight(obj) > can_carry_w(ch))
		{
			send_to_char("You can't carry that much weight.\n\r", ch);
			return;
		}

		if (check_benevolence(ch, keeper))
			cost /= 2;

		/* haggle */

		roll = number_percent();
		bool appraised= false;

		if ((!is_obj_stat(obj, ITEM_SELL_EXTRACT) && roll < get_skill(ch, gsn_haggle))
			|| (appraised = ch->Profs()->HasProf("appraising")))
		{
			if (get_skill(ch, gsn_haggle) > 60)
				cost -= obj->cost / 2 * roll / 100;

			if (appraised && cost)
			{
				float mcost = floor(cost * ch->Profs()->ProfEffect("appraising") / 100);
				cost = static_cast<long>(mcost);
				sprintf(buf, "Knowing it is inflated, you argue the price down to %ld coins.\n\r", cost);
				send_to_char(buf, ch);
			}
			else
			{
				act("You haggle with $N.", ch, nullptr, keeper, TO_CHAR);
			}

			check_improve(ch, gsn_haggle, true, 4);
		}

		act("$n hands some gold to $N.", ch, 0, keeper, TO_ROOM);
		sprintf(buf, "You hand $N %ld gold.", cost * number);
		act(buf, ch, 0, keeper, TO_CHAR);

		for (i = 0; i < number; i++)
		{
			act("$N hands you $p.", ch, obj, keeper, TO_CHAR);
			act("$N hands $n $p.", ch, obj, keeper, TO_ROOM);
		}

		deduct_cost(ch, cost * number);

		for (count = 0; count < number; count++)
		{
			if (IS_SET(obj->extra_flags, ITEM_INVENTORY))
			{
				t_obj = create_object(obj->pIndexData, obj->level);

				if (obj->item_type == ITEM_CONTAINER && obj->contains)
				{
					for (c_obj = obj->contains; c_obj != nullptr; c_obj = c_obj->next_content)
					{
						d_obj = create_object(get_obj_index(c_obj->pIndexData->vnum), c_obj->level);
						obj_to_obj(d_obj, t_obj);
					}
				}
			}
			else
			{
				t_obj = obj;
				obj = obj->next_content;
				obj_from_char(t_obj);
			}

			if (t_obj->timer > 0)
				t_obj->timer = 0;

			obj_to_char(t_obj, ch);

			if (cost < t_obj->cost)
				t_obj->cost = cost;
		}
	}
}